

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.h
# Opt level: O0

bool __thiscall
MetaCommand::AddField
          (MetaCommand *this,string *name,string *description,TypeEnumType type,bool externalData)

{
  string *in_RDX;
  string *in_RSI;
  byte in_R8B;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [48];
  string local_68 [24];
  string *in_stack_ffffffffffffffb0;
  DataEnumType in_stack_ffffffffffffffb8;
  TypeEnumType in_stack_ffffffffffffffbc;
  string *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  MetaCommand *in_stack_ffffffffffffffd0;
  string *psVar1;
  bool local_1;
  
  if ((in_R8B & 1) == 0) {
    psVar1 = in_RDX;
    std::__cxx11::string::string(local_e8,in_RSI);
    std::__cxx11::string::string(local_108,(string *)in_RDX);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"",&local_129);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"",&local_151);
    local_1 = AddField(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0
                       ,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                       in_stack_ffffffffffffffb0,psVar1);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_e8);
  }
  else {
    psVar1 = in_RDX;
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,in_RSI);
    std::__cxx11::string::string(local_68,(string *)in_RDX);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"",&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"",&local_c1);
    local_1 = AddField(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0
                       ,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                       in_stack_ffffffffffffffb0,psVar1);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  }
  return local_1;
}

Assistant:

bool AddField(METAIO_STL::string name,
                METAIO_STL::string description,
                TypeEnumType type,
                bool externalData
                )
    {
    if(externalData)
      {
      return this->AddField(name,description,type,DATA_IN);
      }
    return this->AddField(name,description,type,DATA_NONE);
    }